

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hospital.cpp
# Opt level: O0

void __thiscall
Hospital::Update_Doctors_Time_Table_File
          (Hospital *this,
          vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          *Doctors_Timetable,ofstream *inFile)

{
  reference pvVar1;
  reference pvVar2;
  ostream *poVar3;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_270;
  undefined8 local_268;
  char local_259;
  char *local_258;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_250;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_248;
  undefined8 local_240;
  int local_234;
  int local_230;
  int j;
  int i;
  ostream local_220 [8];
  ofstream abus;
  ofstream *inFile_local;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *Doctors_Timetable_local;
  Hospital *this_local;
  
  system("pause");
  std::ofstream::ofstream(local_220);
  std::ofstream::open((char *)local_220,0x1312c1);
  for (local_230 = 0; local_230 < 7; local_230 = local_230 + 1) {
    for (local_234 = 0; local_234 < 6; local_234 = local_234 + 1) {
      pvVar1 = std::
               vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::operator[](Doctors_Timetable,(long)local_230);
      pvVar2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](pvVar1,(long)local_234);
      pvVar1 = std::
               vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::operator[](Doctors_Timetable,(long)local_230);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](pvVar1,(long)local_234);
      local_250._M_current = (char *)std::__cxx11::string::begin();
      pvVar1 = std::
               vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::operator[](Doctors_Timetable,(long)local_230);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](pvVar1,(long)local_234);
      local_258 = (char *)std::__cxx11::string::end();
      local_259 = ' ';
      local_248 = std::remove<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                            (local_250,
                             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              )local_258,&local_259);
      __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_240,&local_248);
      pvVar1 = std::
               vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::operator[](Doctors_Timetable,(long)local_230);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](pvVar1,(long)local_234);
      local_270._M_current = (char *)std::__cxx11::string::end();
      __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_268,&local_270);
      std::__cxx11::string::erase(pvVar2,local_240,local_268);
      pvVar1 = std::
               vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::operator[](Doctors_Timetable,(long)local_230);
      pvVar2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](pvVar1,(long)local_234);
      poVar3 = std::operator<<(local_220,(string *)pvVar2);
      std::operator<<(poVar3," ");
    }
    std::operator<<(local_220,"\n");
  }
  std::ofstream::~ofstream(local_220);
  return;
}

Assistant:

void Hospital:: Update_Doctors_Time_Table_File (vector<vector<string>> Doctors_Timetable , ofstream& inFile) {

    system("pause");
    //  cout << "hiiiii";
    ofstream abus;
    abus.open("Doctors_Timetable.txt");
    //abus <<"Asghar";

    for (int i = 0; i < 7; i++) {
        for (int j = 0; j < 6; ++j) {
            Doctors_Timetable[i][j] .erase(remove(Doctors_Timetable[i][j] .begin(), Doctors_Timetable[i][j] .end(), ' '), Doctors_Timetable[i][j] .end());
            //    Doctors_Timetable[i][j].erase(std::remove_if(Doctors_Timetable[i][j].begin(), Doctors_Timetable[i][j].end(), ::isspace), Doctors_Timetable[i][j].end());
                abus << Doctors_Timetable[i][j] << " ";
//            abus <<"Asghar";
        }
        abus << "\n";
    }
    //inFile.close();

}